

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfio.c
# Opt level: O2

int zfpeek(zfp *zf)

{
  byte *pbVar1;
  int __c;
  uint uVar2;
  gzFile pgVar3;
  
  if ((FILE *)zf->fp == (FILE *)0x0) {
    pgVar3 = zf->gz;
    if (pgVar3->have == 0) {
      uVar2 = gzgetc(pgVar3);
      if (uVar2 == 0xffffffff) goto LAB_00141bb5;
      pgVar3 = zf->gz;
    }
    else {
      pgVar3->have = pgVar3->have - 1;
      pgVar3->pos = pgVar3->pos + 1;
      pbVar1 = pgVar3->next;
      pgVar3->next = pbVar1 + 1;
      uVar2 = (uint)*pbVar1;
    }
    gzungetc(uVar2,pgVar3);
  }
  else {
    __c = getc((FILE *)zf->fp);
    if (__c != -1) {
      ungetc(__c,(FILE *)zf->fp);
      return __c;
    }
LAB_00141bb5:
    uVar2 = 0xffffffff;
  }
  return uVar2;
}

Assistant:

int zfpeek(zfp *zf) {
    int c;

    if (zf->fp) {
	c = getc(zf->fp);
	if (c != EOF)
	    ungetc(c, zf->fp);
    } else {
	c = gzgetc(zf->gz);
	if (c != EOF)
	    gzungetc(c, zf->gz);
    }

    return c;
}